

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  cmValue cVar6;
  string *psVar7;
  long *plVar8;
  cmake *pcVar9;
  ostream *poVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar12;
  string_view value;
  string_view value_00;
  string_view value_01;
  ostringstream w;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1a8._M_allocated_capacity = (size_type)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1b8 + 0x10),"INTERPROCEDURAL_OPTIMIZATION","");
  cVar6 = GetFeature(this,(string *)(local_1b8 + 0x10),config);
  pcVar12 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
    pcVar12 = extraout_RDX_00;
  }
  if (((cVar6.Value != (string *)0x0) &&
      (value._M_str = pcVar12, value._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p,
      bVar2 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value), bVar2)) &&
     ((iVar4 = std::__cxx11::string::compare((char *)lang), iVar4 == 0 ||
      (((iVar4 = std::__cxx11::string::compare((char *)lang), iVar4 == 0 ||
        (iVar4 = std::__cxx11::string::compare((char *)lang), iVar4 == 0)) ||
       (iVar4 = std::__cxx11::string::compare((char *)lang), iVar4 == 0)))))) {
    iVar4 = std::__cxx11::string::compare((char *)lang);
    if (iVar4 == 0) {
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1b8 + 0x10),"CUDA_ARCHITECTURES","");
      psVar7 = (string *)GetProperty(this,(string *)(local_1b8 + 0x10));
      if (psVar7 == (string *)0x0) {
        psVar7 = &cmValue::Empty_abi_cxx11_;
      }
      value_00._M_str = (psVar7->_M_dataplus)._M_p;
      value_00._M_len = psVar7->_M_string_length;
      bVar2 = cmValue::IsOff(value_00);
      bVar3 = true;
      if (!bVar2) {
        local_1d8._0_8_ = local_1d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"CUDA_SEPARABLE_COMPILATION","");
        psVar7 = (string *)GetProperty(this,(string *)local_1d8);
        if (psVar7 == (string *)0x0) {
          psVar7 = &cmValue::Empty_abi_cxx11_;
        }
        value_01._M_str = (psVar7->_M_dataplus)._M_p;
        value_01._M_len = psVar7->_M_string_length;
        bVar3 = cmValue::IsOff(value_01);
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      if (bVar3 != false) {
        return false;
      }
    }
    PVar5 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0069);
    pcVar1 = this->Makefile;
    if (PVar5 < NEW) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "_CMAKE_",lang);
      plVar8 = (long *)std::__cxx11::string::append(local_1d8);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar11) {
        local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_198[0]._8_8_ = plVar8[3];
        local_1a8._M_allocated_capacity = (size_type)local_198;
      }
      else {
        local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_1a8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_1a8._8_8_ = plVar8[1];
      *plVar8 = (long)paVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      pcVar12 = local_1d8 + 0x10;
      if ((char *)local_1d8._0_8_ != pcVar12) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      if (bVar2) {
        return true;
      }
      if (this->PolicyReportedCMP0069 == false) {
        pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        bVar2 = cmake::GetIsInTryCompile(pcVar9);
        if (PVar5 != WARN) {
          return false;
        }
        if (bVar2) {
          return false;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1d8,(cmPolicies *)&DAT_00000045,id);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_1b8 + 0x10),(char *)local_1d8._0_8_,local_1d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((char *)local_1d8._0_8_ != pcVar12) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),
                   "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target ",0x41);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\'",1);
        psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_1b8 + 0x10),(psVar7->_M_dataplus)._M_p,
                             psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'.",2);
        pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)local_1b8);
        cmake::IssueMessage(pcVar9,AUTHOR_WARNING,(string *)local_1d8,
                            (cmListFileBacktrace *)local_1b8);
        if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if ((char *)local_1d8._0_8_ != pcVar12) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        this->PolicyReportedCMP0069 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "_CMAKE_",lang);
      plVar8 = (long *)std::__cxx11::string::append(local_1d8);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar11) {
        local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_198[0]._8_8_ = plVar8[3];
        local_1a8._M_allocated_capacity = (size_type)local_198;
      }
      else {
        local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_1a8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_1a8._8_8_ = plVar8[1];
      *plVar8 = (long)paVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,"_CMAKE_",lang);
        plVar8 = (long *)std::__cxx11::string::append(local_1d8);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar11) {
          local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
          local_198[0]._8_8_ = plVar8[3];
          local_1a8._M_allocated_capacity = (size_type)local_198;
        }
        else {
          local_198[0]._0_8_ = paVar11->_M_allocated_capacity;
          local_1a8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_1a8._8_8_ = plVar8[1];
        *plVar8 = (long)paVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          local_198[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        if (bVar2) {
          iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2d])();
          if ((char)iVar4 != '\0') {
            return true;
          }
          pcVar12 = "CMake doesn\'t support IPO for current generator";
        }
        else {
          pcVar12 = "Compiler doesn\'t support IPO";
        }
      }
      else {
        pcVar12 = "CMake doesn\'t support IPO for current compiler";
      }
      if (this->PolicyReportedCMP0069 == false) {
        this->PolicyReportedCMP0069 = true;
        pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_1b8 + 0x10),pcVar12,(allocator<char> *)local_1b8);
        GetBacktrace((cmGeneratorTarget *)local_1d8);
        cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)(local_1b8 + 0x10),
                            (cmListFileBacktrace *)local_1d8);
        if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          local_198[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  cmValue feature = this->GetFeature("INTERPROCEDURAL_OPTIMIZATION", config);

  if (!cmIsOn(feature)) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "CUDA" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  if (lang == "CUDA") {
    // CUDA IPO requires both CUDA_ARCHITECTURES and CUDA_SEPARABLE_COMPILATION
    if (cmIsOff(this->GetSafeProperty("CUDA_ARCHITECTURES")) ||
        cmIsOff(this->GetSafeProperty("CUDA_SEPARABLE_COMPILATION"))) {
      return false;
    }
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = nullptr;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}